

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::AddGlyph(ImFont *this,ImFontConfig_conflict *cfg,ImWchar codepoint,float x0,float y0,
                float x1,float y1,float u0,float v0,float u1,float v1,float advance_x)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  ImFontGlyph *pIVar4;
  ImFontAtlas_conflict *pIVar5;
  ImFontGlyph *__dest;
  wchar_t wVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  
  if (cfg != (ImFontConfig_conflict *)0x0) {
    fVar8 = cfg->GlyphMaxAdvanceX;
    if (advance_x <= cfg->GlyphMaxAdvanceX) {
      fVar8 = advance_x;
    }
    uVar7 = -(uint)(advance_x < cfg->GlyphMinAdvanceX);
    fVar8 = (float)(uVar7 & (uint)cfg->GlyphMinAdvanceX | ~uVar7 & (uint)fVar8);
    if ((fVar8 != advance_x) || (NAN(fVar8) || NAN(advance_x))) {
      fVar9 = (fVar8 - advance_x) * 0.5;
      if (cfg->PixelSnapH != false) {
        fVar9 = (float)(int)fVar9;
      }
      x0 = x0 + fVar9;
      x1 = x1 + fVar9;
    }
    if (cfg->PixelSnapH != false) {
      fVar8 = (float)(int)(fVar8 + 0.5);
    }
    advance_x = fVar8 + (cfg->GlyphExtraSpacing).x;
  }
  wVar2 = (this->Glyphs).Size;
  wVar3 = (this->Glyphs).Capacity;
  wVar1 = wVar2 + L'\x01';
  if (wVar3 <= wVar2) {
    if (wVar3 == L'\0') {
      wVar6 = L'\b';
    }
    else {
      wVar6 = wVar3 / 2 + wVar3;
    }
    if (wVar6 <= wVar1) {
      wVar6 = wVar1;
    }
    if (wVar3 < wVar6) {
      __dest = (ImFontGlyph *)ImGui::MemAlloc((long)wVar6 * 0x28);
      pIVar4 = (this->Glyphs).Data;
      if (pIVar4 != (ImFontGlyph *)0x0) {
        memcpy(__dest,pIVar4,(long)(this->Glyphs).Size * 0x28);
        ImGui::MemFree((this->Glyphs).Data);
      }
      (this->Glyphs).Data = __dest;
      (this->Glyphs).Capacity = wVar6;
    }
  }
  (this->Glyphs).Size = wVar1;
  if (wVar2 < L'\0') {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                  ,0x70f,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
  }
  pIVar4 = (this->Glyphs).Data;
  *(uint *)(pIVar4 + ((ulong)(uint)wVar1 - 1)) =
       (uint)codepoint * 4 + (-(uint)(y0 != y1 && x0 != x1) & 1) * 2;
  pIVar4[(ulong)(uint)wVar1 - 1].X0 = x0;
  pIVar4[(ulong)(uint)wVar1 - 1].Y0 = y0;
  pIVar4[(ulong)(uint)wVar1 - 1].X1 = x1;
  pIVar4[(ulong)(uint)wVar1 - 1].Y1 = y1;
  pIVar4[(ulong)(uint)wVar1 - 1].U0 = u0;
  pIVar4[(ulong)(uint)wVar1 - 1].V0 = v0;
  pIVar4[(ulong)(uint)wVar1 - 1].U1 = u1;
  pIVar4[(ulong)(uint)wVar1 - 1].V1 = v1;
  pIVar4[(ulong)(uint)wVar1 - 1].AdvanceX = advance_x;
  pIVar5 = this->ContainerAtlas;
  fVar8 = (float)pIVar5->TexGlyphPadding + 0.99;
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       this->MetricsTotalSurface +
       (int)((float)pIVar5->TexHeight * (v1 - v0) + fVar8) *
       (int)((float)pIVar5->TexWidth * (u1 - u0) + fVar8);
  return;
}

Assistant:

void ImFont::AddGlyph(const ImFontConfig* cfg, ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    if (cfg != NULL)
    {
        // Clamp & recenter if needed
        const float advance_x_original = advance_x;
        advance_x = ImClamp(advance_x, cfg->GlyphMinAdvanceX, cfg->GlyphMaxAdvanceX);
        if (advance_x != advance_x_original)
        {
            float char_off_x = cfg->PixelSnapH ? ImFloor((advance_x - advance_x_original) * 0.5f) : (advance_x - advance_x_original) * 0.5f;
            x0 += char_off_x;
            x1 += char_off_x;
        }

        // Snap to pixel
        if (cfg->PixelSnapH)
            advance_x = IM_ROUND(advance_x);

        // Bake spacing
        advance_x += cfg->GlyphExtraSpacing.x;
    }

    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.Colored = false;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x;

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    // We use (U1-U0)*TexWidth instead of X1-X0 to account for oversampling.
    float pad = ContainerAtlas->TexGlyphPadding + 0.99f;
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + pad) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + pad);
}